

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O2

int Ssw_ManSweepBmc(Ssw_Man_t *p)

{
  uint uVar1;
  abctime aVar2;
  Aig_Man_t *pAVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  void *pvVar7;
  abctime aVar8;
  Ssw_Pars_t *pSVar9;
  char *pString;
  int iVar10;
  int iVar11;
  int i;
  Bar_Progress_t *local_40;
  
  aVar2 = Abc_Clock();
  pAVar3 = Aig_ManStart(p->pPars->nFramesK * p->pAig->vObjs->nSize);
  p->pFrames = pAVar3;
  for (iVar10 = 0; pAVar3 = p->pAig, iVar10 < pAVar3->nRegs; iVar10 = iVar10 + 1) {
    pvVar4 = Vec_PtrEntry(pAVar3->vCis,pAVar3->nTruePis + iVar10);
    p->pNodeToFrames[(long)*(int *)((long)pvVar4 + 0x24) * (long)p->nFrames] =
         (Aig_Obj_t *)((ulong)p->pFrames->pConst1 ^ 1);
  }
  p->fRefined = 0;
  if (p->pPars->fVerbose == 0) {
    local_40 = (Bar_Progress_t *)0x0;
    iVar10 = 0;
  }
  else {
    local_40 = Bar_ProgressStart(_stdout,p->pPars->nFramesK * pAVar3->vObjs->nSize);
    iVar10 = 0;
  }
  while (i = iVar10, pSVar9 = p->pPars, i < pSVar9->nFramesK) {
    p->pNodeToFrames[p->pAig->pConst1->Id * p->nFrames + i] = p->pFrames->pConst1;
    for (iVar10 = 0; pAVar3 = p->pAig, iVar10 < pAVar3->nTruePis; iVar10 = iVar10 + 1) {
      pvVar4 = Vec_PtrEntry(pAVar3->vCis,iVar10);
      pAVar5 = Aig_ObjCreateCi(p->pFrames);
      p->pNodeToFrames[*(int *)((long)pvVar4 + 0x24) * p->nFrames + i] = pAVar5;
    }
    for (iVar10 = 0; iVar10 < pAVar3->vObjs->nSize; iVar10 = iVar10 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAVar3->vObjs,iVar10);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
        if (p->pPars->fVerbose != 0) {
          Bar_ProgressUpdate(local_40,p->pAig->vObjs->nSize * i + iVar10,pString);
        }
        pAVar3 = p->pFrames;
        pAVar6 = Ssw_ObjChild0Fra(p,pAVar5,i);
        p1 = Ssw_ObjChild1Fra(p,pAVar5,i);
        pAVar6 = Aig_And(pAVar3,pAVar6,p1);
        p->pNodeToFrames[pAVar5->Id * p->nFrames + i] = pAVar6;
        uVar1 = Ssw_ManSweepNode(p,pAVar5,i,1,(Vec_Int_t *)0x0);
        p->fRefined = p->fRefined | uVar1;
      }
      pAVar3 = p->pAig;
    }
    pSVar9 = p->pPars;
    if (i == pSVar9->nFramesK + -1) break;
    for (iVar10 = 0; iVar10 < pAVar3->vCos->nSize; iVar10 = iVar10 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAVar3->vCos,iVar10);
      pAVar6 = Ssw_ObjChild0Fra(p,pAVar5,i);
      p->pNodeToFrames[pAVar5->Id * p->nFrames + i] = pAVar6;
      pAVar3 = p->pAig;
    }
    for (iVar11 = 0; iVar10 = i + 1, iVar11 < pAVar3->nRegs; iVar11 = iVar11 + 1) {
      pvVar4 = Vec_PtrEntry(pAVar3->vCos,pAVar3->nTruePos + iVar11);
      pvVar7 = Vec_PtrEntry(p->pAig->vCis,p->pAig->nTruePis + iVar11);
      pAVar5 = p->pNodeToFrames[*(int *)((long)pvVar4 + 0x24) * p->nFrames + i];
      p->pNodeToFrames[p->nFrames * *(int *)((long)pvVar7 + 0x24) + i + 1] = pAVar5;
      Ssw_CnfNodeAddToSolver(p->pMSat,(Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe));
      pAVar3 = p->pAig;
    }
  }
  if (pSVar9->fVerbose != 0) {
    Bar_ProgressStop(local_40);
  }
  aVar8 = Abc_Clock();
  p->timeBmc = p->timeBmc + (aVar8 - aVar2);
  return p->fRefined;
}

Assistant:

int Ssw_ManSweepBmc( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    int i, f;
    abctime clk;
clk = Abc_Clock();

    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrames) );

    // sweep internal nodes
    p->fRefined = 0;
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            if ( p->pPars->fVerbose )
                Bar_ProgressUpdate( pProgress, Aig_ManObjNumMax(p->pAig) * f + i, NULL );
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 1, NULL );
        }
        // quit if this is the last timeframe
        if ( f == p->pPars->nFramesK - 1 )
            break;
        // transfer latch input to the latch outputs
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj, f) );
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjFrame( p, pObjLi, f );
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );//
        }
    }
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
p->timeBmc += Abc_Clock() - clk;
    return p->fRefined;
}